

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

Error asmjit::Logging::formatNode
                (StringBuilder *sb,uint32_t logOptions,CodeBuilder *cb,CBNode *node_)

{
  Error EVar1;
  uint32_t uVar2;
  CBData *in_RCX;
  StringBuilder *sb_00;
  StringBuilder *in_RDI;
  Error _err_16;
  Error _err_15;
  CCFuncCall *node_6;
  Error _err_14;
  Error _err_13;
  Error _err_12;
  Error _err_11;
  Error _err_10;
  Error _err_9;
  Error _err_8;
  Error _err_7;
  CCFunc *node_5;
  Error _err_6;
  Error _err_5;
  CBComment *node_4;
  Error _err_4;
  CBAlign *node_3;
  Error _err_3;
  CBData *node_2;
  Error _err_2;
  CBLabel *node_1;
  Error _err_1;
  CBInst *node;
  Error _err;
  size_t in_stack_fffffffffffffd60;
  char *pcVar3;
  char *in_stack_fffffffffffffd68;
  uint32_t archType;
  undefined4 in_stack_fffffffffffffd70;
  uint32_t in_stack_fffffffffffffd74;
  StringBuilder *in_stack_fffffffffffffd78;
  uint32_t logOptions_00;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  CodeEmitter *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  uint32_t in_stack_fffffffffffffd9c;
  uint in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  uint32_t in_stack_fffffffffffffdd4;
  CodeEmitter *in_stack_fffffffffffffdd8;
  uint32_t in_stack_fffffffffffffde4;
  StringBuilder *in_stack_fffffffffffffde8;
  Error local_1c4;
  
  if (((in_RCX->super_CBNode)._position != 0) &&
     (EVar1 = StringBuilder::appendFormat(in_RDI,"<%04u> ",(ulong)(in_RCX->super_CBNode)._position),
     EVar1 != 0)) {
    return EVar1;
  }
  sb_00 = (StringBuilder *)(ulong)((in_RCX->super_CBNode)._type - 1);
  uVar2 = (uint32_t)(in_stack_fffffffffffffd60 >> 0x20);
  archType = (uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  logOptions_00 = (uint32_t)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  switch(sb_00) {
  case (StringBuilder *)0x0:
    EVar1 = formatInstruction(sb_00,logOptions_00,
                              (CodeEmitter *)
                              CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),archType
                              ,(uint32_t)in_stack_fffffffffffffd68,uVar2,
                              (Operand_ *)in_stack_fffffffffffffd90,
                              (Operand_ *)
                              CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                              in_stack_fffffffffffffda0);
    goto joined_r0x00121600;
  case (StringBuilder *)0x1:
    uVar2 = CBData::getSize(in_RCX);
    EVar1 = StringBuilder::appendFormat(in_RDI,".embed (%u bytes)",(ulong)uVar2);
joined_r0x00121600:
    if (EVar1 != 0) {
      return EVar1;
    }
    goto LAB_00121d57;
  case (StringBuilder *)0x2:
    if (*(int *)&in_RCX->field_0 == 0) {
      pcVar3 = "code";
    }
    else {
      pcVar3 = "data";
    }
    local_1c4 = StringBuilder::appendFormat
                          (in_RDI,".align %u (%s)",(ulong)*(uint *)((long)&in_RCX->field_0 + 4),
                           pcVar3);
    break;
  case (StringBuilder *)0x3:
    local_1c4 = StringBuilder::appendFormat(in_RDI,"L%u:",(ulong)(*(int *)&in_RCX->field_0 - 0x100))
    ;
    break;
  default:
    local_1c4 = StringBuilder::appendFormat
                          (in_RDI,"[unknown (type=%u)]",(ulong)(in_RCX->super_CBNode)._type);
    break;
  case (StringBuilder *)0x6:
    local_1c4 = StringBuilder::appendFormat(in_RDI,"; %s",(in_RCX->super_CBNode)._inlineComment);
    break;
  case (StringBuilder *)0x7:
    local_1c4 = StringBuilder::_opString
                          (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                           in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    break;
  case (StringBuilder *)0xf:
    EVar1 = formatLabel(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                        in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
    if (EVar1 != 0) {
      return EVar1;
    }
    EVar1 = StringBuilder::_opString
                      (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,in_stack_fffffffffffffd68
                       ,in_stack_fffffffffffffd60);
    if (EVar1 != 0) {
      return EVar1;
    }
    EVar1 = formatFuncRets((StringBuilder *)
                           CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                           in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                           (FuncDetail *)
                           CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                           (VirtReg **)sb_00);
    if (EVar1 != 0) {
      return EVar1;
    }
    EVar1 = StringBuilder::_opString
                      (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,in_stack_fffffffffffffd68
                       ,in_stack_fffffffffffffd60);
    if (EVar1 != 0) {
      return EVar1;
    }
    EVar1 = StringBuilder::_opString
                      (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,in_stack_fffffffffffffd68
                       ,in_stack_fffffffffffffd60);
    if (EVar1 != 0) {
      return EVar1;
    }
    EVar1 = formatFuncArgs((StringBuilder *)(ulong)in_stack_fffffffffffffda0,
                           in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                           (FuncDetail *)
                           CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                           (VirtReg **)sb_00);
    if (EVar1 != 0) {
      return EVar1;
    }
    local_1c4 = StringBuilder::_opString
                          (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                           in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    break;
  case (StringBuilder *)0x10:
    local_1c4 = StringBuilder::_opString
                          (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                           in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    break;
  case (StringBuilder *)0x11:
    local_1c4 = formatInstruction(sb_00,logOptions_00,
                                  (CodeEmitter *)
                                  CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                  archType,(uint32_t)in_stack_fffffffffffffd68,uVar2,
                                  (Operand_ *)in_RCX,
                                  (Operand_ *)
                                  CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                                  in_stack_fffffffffffffda0);
  }
  if (local_1c4 == 0) {
LAB_00121d57:
    local_1c4 = 0;
  }
  return local_1c4;
}

Assistant:

Error Logging::formatNode(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeBuilder* cb,
  const CBNode* node_) noexcept {

  if (node_->hasPosition())
    ASMJIT_PROPAGATE(sb.appendFormat("<%04u> ", node_->getPosition()));

  switch (node_->getType()) {
    case CBNode::kNodeInst: {
      const CBInst* node = node_->as<CBInst>();
      ASMJIT_PROPAGATE(
        Logging::formatInstruction(sb, logOptions, cb,
          cb->getArchType(),
          node->getInstId(),
          node->getOptions(),
          node->getExtraOp(),
          node->getOpArray(), node->getOpCount()));
      break;
    }

    case CBNode::kNodeLabel: {
      const CBLabel* node = node_->as<CBLabel>();
      ASMJIT_PROPAGATE(sb.appendFormat("L%u:", Operand::unpackId(node->getId())));
      break;
    }

    case CBNode::kNodeData: {
      const CBData* node = node_->as<CBData>();
      ASMJIT_PROPAGATE(sb.appendFormat(".embed (%u bytes)", node->getSize()));
      break;
    }

    case CBNode::kNodeAlign: {
      const CBAlign* node = node_->as<CBAlign>();
      ASMJIT_PROPAGATE(
        sb.appendFormat(".align %u (%s)",
          node->getAlignment(),
          node->getMode() == kAlignCode ? "code" : "data"));
      break;
    }

    case CBNode::kNodeComment: {
      const CBComment* node = node_->as<CBComment>();
      ASMJIT_PROPAGATE(sb.appendFormat("; %s", node->getInlineComment()));
      break;
    }

    case CBNode::kNodeSentinel: {
      ASMJIT_PROPAGATE(sb.appendString("[sentinel]"));
      break;
    }

#if !defined(ASMJIT_DISABLE_COMPILER)
    case CBNode::kNodeFunc: {
      const CCFunc* node = node_->as<CCFunc>();
      ASMJIT_PROPAGATE(formatLabel(sb, logOptions, cb, node->getId()));

      ASMJIT_PROPAGATE(sb.appendString(": ["));
      ASMJIT_PROPAGATE(formatFuncRets(sb, logOptions, cb, node->getDetail(), nullptr));
      ASMJIT_PROPAGATE(sb.appendString("]"));

      ASMJIT_PROPAGATE(sb.appendString("("));
      ASMJIT_PROPAGATE(formatFuncArgs(sb, logOptions, cb, node->getDetail(), node->getArgs()));
      ASMJIT_PROPAGATE(sb.appendString(")"));
      break;
    }

    case CBNode::kNodeFuncExit: {
      ASMJIT_PROPAGATE(sb.appendString("[ret]"));
      break;
    }

    case CBNode::kNodeFuncCall: {
      const CCFuncCall* node = node_->as<CCFuncCall>();
      ASMJIT_PROPAGATE(
        Logging::formatInstruction(sb, logOptions, cb,
          cb->getArchType(),
          node->getInstId(),
          node->getOptions(),
          node->getExtraOp(),
          node->getOpArray(), node->getOpCount()));
      break;
    }
#endif // !ASMJIT_DISABLE_COMPILER

    default: {
      ASMJIT_PROPAGATE(sb.appendFormat("[unknown (type=%u)]", node_->getType()));
      break;
    }
  }

  return kErrorOk;
}